

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_4::Validator::OnDelegateExpr(Validator *this,TryExpr *expr)

{
  Var local_70;
  Enum local_24;
  TryExpr *local_20;
  TryExpr *expr_local;
  Validator *this_local;
  
  local_20 = expr;
  expr_local = (TryExpr *)this;
  Var::Var(&local_70,&expr->delegate_target);
  local_24 = (Enum)SharedValidator::OnDelegate
                             (&this->validator_,(Location *)&expr->field_0x18,&local_70);
  Result::operator|=(&this->result_,(Result)local_24);
  Var::~Var(&local_70);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnDelegateExpr(TryExpr* expr) {
  result_ |= validator_.OnDelegate(expr->loc, expr->delegate_target);
  return Result::Ok;
}